

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  MocT *genVars;
  _Rb_tree_header *p_Var1;
  anon_struct_576_15_8dd4ea9d_for_AutogenTarget *utilityName;
  uint uVar2;
  pointer ppVar3;
  pointer ppVar4;
  cmGeneratorTarget *this_00;
  pointer pcVar5;
  cmLocalGenerator *pcVar6;
  string_view suffix;
  ulong uVar7;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var8;
  undefined8 uVar9;
  pointer pcVar10;
  pointer pcVar11;
  bool bVar12;
  TargetType TVar13;
  long lVar14;
  string *psVar15;
  _Rb_tree_node_base *p_Var16;
  cmLinkImplementationLibraries *pcVar17;
  mapped_type_conflict2 *pmVar18;
  undefined8 uVar19;
  cmTarget *pcVar20;
  cmGeneratorTarget *pcVar21;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *psVar22;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *uiFile;
  pointer filename;
  pointer __x;
  char *pcVar23;
  pointer pcVar24;
  pointer pbVar25;
  undefined4 uVar26;
  undefined8 unaff_RBP;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer pbVar27;
  char *pcVar28;
  pointer pcVar29;
  __node_base *p_Var30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar31;
  pointer pcVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar34;
  string_view prefix;
  __single_object cc_3;
  __single_object cc_1;
  string timestampFileGenex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string tools;
  cmCustomCommandLines commandLines;
  string autogenComment;
  cmCustomCommand cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenByproducts;
  cmGeneratorTarget *libTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampByproducts;
  cmCustomCommandLines timestampTargetCommandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  char timestampFileName [10];
  _Head_base<0UL,_cmCustomCommand_*,_false> local_4e0;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [8];
  cmCustomCommand *local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Rb_tree_node_base *local_498;
  size_t local_490;
  GenVarsT *local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  pointer local_448;
  pointer local_440;
  cmCustomCommand *local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  undefined4 local_424;
  string *local_420;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_418;
  cmCustomCommandLine *local_400;
  element_type *local_3f8;
  cmCustomCommandLine local_3f0;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_3d8;
  _Alloc_hider local_3d0;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_3c8;
  undefined1 local_3c0 [16];
  _Alloc_hider local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [24];
  _Alloc_hider _Stack_370;
  pointer local_368;
  undefined1 auStack_360 [16];
  _Alloc_hider _Stack_350;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_348;
  undefined8 local_338;
  pointer ppStack_330;
  pointer local_328;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  char *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined2 local_280;
  bool local_27e;
  undefined4 local_27d;
  PolicyStatus local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string *local_208;
  pointer local_200;
  cmListFileBacktrace local_1f8;
  string local_1e8;
  string local_1c8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  undefined8 local_170;
  char *pcStack_168;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pointer local_40;
  undefined2 local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->OutputFiles,&(this->AutogenTarget).InfoFile);
  uVar2 = (this->QtVersion).Major;
  if (uVar2 < 6) {
    unaff_RBP = 0;
    uVar26 = 0;
    if ((uVar2 == 5) && (uVar26 = 0, 0xe < (this->QtVersion).Minor)) goto LAB_00430f64;
  }
  else {
LAB_00430f64:
    (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_3a8);
    lVar14 = std::__cxx11::string::find(local_3a8,0x67b1d1,0);
    uVar26 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),lVar14 != -1);
    if ((undefined1 *)local_3a8._0_8_ != local_398) {
      operator_delete((void *)local_3a8._0_8_,local_398._0_8_ + 1);
    }
  }
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  genVars = &this->Moc;
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    AddGeneratedSource(this,&(this->Moc).CompilationFile,&genVars->super_GenVarsT,true);
    if ((char)uVar26 == '\0') {
      this_01 = &local_268;
    }
    else {
      if (this->MultiConfig == true) {
        p_Var30 = &(this->Moc).CompilationFile.Config._M_h._M_before_begin;
        while (p_Var30 = p_Var30->_M_nxt, p_Var30 != (__node_base *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_228,(value_type *)(p_Var30 + 5));
        }
        goto LAB_00431065;
      }
      this_01 = &local_228;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_01,&(this->Moc).CompilationFileGenex);
  }
LAB_00431065:
  local_488 = &(this->Uic).super_GenVarsT;
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    filename = (this->Uic).UiHeaders.
               super__Vector_base<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (this->Uic).UiHeaders.
             super__Vector_base<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (filename != ppVar3) {
      do {
        AddGeneratedSource(this,&filename->first,local_488,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_268,&filename->second);
        filename = filename + 1;
      } while (filename != ppVar3);
    }
  }
  local_400 = &local_3f0;
  local_3f8 = (element_type *)0x0;
  local_3f0.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  local_468._8_8_ = (cmCustomCommand *)0x0;
  local_458._0_8_ = local_458._0_8_ & 0xffffffffffffff00;
  local_468._0_8_ = (cmCustomCommand *)local_458;
  if ((genVars->super_GenVarsT).Enabled == true) {
    std::__cxx11::string::append(local_468);
    if (((GenVarsT *)&local_488->Enabled)->Enabled == false) goto LAB_00431164;
    if ((cmCustomCommand *)local_468._8_8_ != (cmCustomCommand *)0x0) {
      std::__cxx11::string::append(local_468);
    }
  }
  else if (((GenVarsT *)&local_488->Enabled)->Enabled == false) goto LAB_00431164;
  std::__cxx11::string::append(local_468);
LAB_00431164:
  uVar9 = local_468._8_8_;
  uVar19 = local_468._0_8_;
  psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  local_3a8._0_8_ = (pointer)0xa;
  local_3a8._8_8_ = "Automatic ";
  local_398._8_8_ = uVar19;
  local_388._0_8_ = (pointer)0xc;
  local_388._8_8_ = (long)" set to OLD for target " + 0xb;
  _Stack_370._M_p = (psVar15->_M_dataplus)._M_p;
  local_388._16_8_ = psVar15->_M_string_length;
  views._M_len = 4;
  views._M_array = (iterator)local_3a8;
  local_398._0_8_ = uVar9;
  cmCatViews_abi_cxx11_((string *)local_4b8,views);
  std::__cxx11::string::operator=((string *)&local_400,(string *)local_4b8);
  if (local_4b8 != (undefined1  [8])&local_4a8) {
    operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
  }
  if ((cmCustomCommand *)local_468._0_8_ != (cmCustomCommand *)local_458) {
    operator_delete((void *)local_468._0_8_,(ulong)(local_458._0_8_ + 1));
  }
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_424 = uVar26;
  local_3f0.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)genVars;
  (*this->GlobalGen->_vptr_cmGlobalGenerator[0x38])();
  pbVar25 = local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_418.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar27 = local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      psVar15 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_3a8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_3a8._0_8_ = psVar15->_M_string_length;
      local_398._0_8_ = (cmCustomCommand *)0x2;
      local_398._8_8_ = "-E";
      local_388._0_8_ = (pointer)0xd;
      local_388._8_8_ = "cmake_autogen";
      _Stack_370._M_p = (this->AutogenTarget).InfoFile._M_dataplus._M_p;
      local_388._16_8_ = (this->AutogenTarget).InfoFile._M_string_length;
      auStack_360._0_8_ = (pbVar27->_M_dataplus)._M_p;
      local_368 = (pointer)pbVar27->_M_string_length;
      ilist._M_len = 5;
      ilist._M_array = (iterator)local_3a8;
      cmMakeCommandLine((cmCustomCommandLine *)local_468,ilist);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_418,(cmCustomCommandLine *)local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_468);
      pbVar27 = pbVar27 + 1;
    } while (pbVar27 != pbVar25);
  }
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_3a8);
  lVar14 = std::__cxx11::string::find(local_3a8,0x6a1c19,0);
  if ((undefined1 *)local_3a8._0_8_ != local_398) {
    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
  }
  if (((lVar14 == -1) || ((this->AutogenTarget).GlobalTarget != false)) ||
     ((this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    if ((this->AutogenTarget).DependOrigin == true) {
      local_4a8._8_8_ = &local_4b0;
      local_4b0 = (cmCustomCommand *)((ulong)local_4b0 & 0xffffffff00000000);
      local_4a8._M_allocated_capacity = 0;
      local_490 = 0;
      psVar15 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_208 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_498 = (_Rb_tree_node_base *)local_4a8._8_8_;
      if (psVar15 != local_208) {
        do {
          local_420 = psVar15;
          pcVar17 = cmGeneratorTarget::GetLinkImplementationLibraries(this->GenTarget,psVar15,Link);
          if (pcVar17 != (cmLinkImplementationLibraries *)0x0) {
            pcVar29 = (pcVar17->Libraries).
                      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_200 = (pcVar17->Libraries).
                        super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            if (pcVar29 != local_200) {
              do {
                pcVar21 = (pcVar29->super_cmLinkItem).Target;
                local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar21;
                if (pcVar21 != (cmGeneratorTarget *)0x0) {
                  this_00 = this->GenTarget;
                  local_4d8._0_8_ = pcVar21;
                  TVar13 = cmGeneratorTarget::GetType(this_00);
                  if ((TVar13 == STATIC_LIBRARY) &&
                     (TVar13 = cmGeneratorTarget::GetType(pcVar21), TVar13 == STATIC_LIBRARY)) {
                    local_468._8_8_ = local_468._8_8_ & 0xffffffff00000000;
                    local_458._0_8_ = (pointer)0x0;
                    local_458._8_8_ = local_468 + 8;
                    local_440 = (pointer)0x0;
                    local_368 = (pointer)0x0;
                    auStack_360._0_8_ = 0;
                    local_388._16_8_ = (cmCustomCommand *)0x0;
                    _Stack_370._M_p = (pointer)0x0;
                    local_388._0_8_ = (pointer)0x0;
                    local_388._8_8_ = (char *)0x0;
                    local_398._0_8_ = (cmCustomCommand *)0x0;
                    local_398._8_8_ = (cmCustomCommand *)0x0;
                    local_3a8._0_8_ = (pointer)0x0;
                    local_3a8._8_8_ = (pointer)0x0;
                    local_448 = (pointer)local_458._8_8_;
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::_M_initialize_map((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                         *)local_3a8,0);
                    std::
                    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    ::_M_insert_unique<cmGeneratorTarget_const*const&>
                              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                *)local_468,(cmGeneratorTarget **)local_4d8);
                    if ((undefined1 *)local_388._16_8_ ==
                        (undefined1 *)((long)&local_368[-1].field_2 + 8)) {
                      std::deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                      ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                  *)local_3a8,(cmGeneratorTarget **)local_4d8);
                    }
                    else {
                      *(undefined8 *)local_388._16_8_ = local_4d8._0_8_;
                      local_388._16_8_ = local_388._16_8_ + 8;
                    }
                    if (local_388._16_8_ != local_398._0_8_) {
                      do {
                        pcVar21 = *(cmGeneratorTarget **)local_398._0_8_;
                        if ((undefined1 *)local_398._0_8_ ==
                            (undefined1 *)((long)&((pointer)(local_388._0_8_ + -0x20))->field_2 + 8)
                           ) {
                          operator_delete((void *)local_398._8_8_,0x200);
                          local_398._0_8_ = *(undefined8 *)(local_388._8_8_ + 8);
                          local_388._0_8_ =
                               &((cmCustomCommand *)(local_398._0_8_ + 0x138))->WorkingDirectory;
                          local_398._8_8_ = local_398._0_8_;
                          local_388._8_8_ = (char *)(local_388._8_8_ + 8);
                        }
                        else {
                          local_398._0_8_ = local_398._0_8_ + 8;
                        }
                        if (pcVar21 == this_00) {
                          std::
                          _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                          *)local_3a8);
                          std::
                          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                          ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                       *)local_468);
                          goto LAB_00431cc6;
                        }
                        pcVar17 = cmGeneratorTarget::GetLinkImplementationLibraries
                                            (pcVar21,local_420,Link);
                        if (pcVar17 != (cmLinkImplementationLibraries *)0x0) {
                          pcVar5 = (pcVar17->Libraries).
                                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          for (pcVar24 = (pcVar17->Libraries).
                                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                              pcVar24 != pcVar5; pcVar24 = pcVar24 + 1) {
                            local_480.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)(pcVar24->super_cmLinkItem).Target;
                            if ((((cmGeneratorTarget *)
                                  local_480.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start !=
                                  (cmGeneratorTarget *)0x0) &&
                                (TVar13 = cmGeneratorTarget::GetType
                                                    ((cmGeneratorTarget *)
                                                     local_480.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                TVar13 == STATIC_LIBRARY)) &&
                               (pVar34 = std::
                                         _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                         ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                                   ((
                                                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                                  *)local_468,(cmGeneratorTarget **)&local_480),
                               ((undefined1  [16])pVar34 & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0)) {
                              if ((undefined1 *)local_388._16_8_ ==
                                  (undefined1 *)((long)&local_368[-1].field_2 + 8)) {
                                std::
                                deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                          ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                            *)local_3a8,(cmGeneratorTarget **)&local_480);
                              }
                              else {
                                *(pointer *)local_388._16_8_ =
                                     local_480.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_388._16_8_ = local_388._16_8_ + 8;
                              }
                            }
                          }
                        }
                      } while (local_388._16_8_ != local_398._0_8_);
                    }
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                    *)local_3a8);
                    std::
                    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                 *)local_468);
                  }
                  pmVar18 = std::
                            map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                            ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                          *)local_4b8,(key_type *)&local_248);
                  *pmVar18 = *pmVar18 + 1;
                }
LAB_00431cc6:
                pcVar29 = pcVar29 + 1;
              } while (pcVar29 != local_200);
            }
          }
          psVar15 = local_420 + 1;
        } while (psVar15 != local_208);
        if ((_Rb_tree_node_base *)local_4a8._8_8_ != (_Rb_tree_node_base *)&local_4b0) {
          uVar19 = local_4a8._8_8_;
          do {
            if (((_Rb_tree_node_base *)(uVar19 + 0x20))->_M_parent ==
                (_Base_ptr)
                ((long)(this->ConfigsList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->ConfigsList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::
              _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
              ::_M_insert_unique<cmTarget*const&>
                        ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                          *)&(this->AutogenTarget).DependTargets,*(cmTarget ***)(uVar19 + 0x20));
            }
            uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
          } while ((_Rb_tree_node_base *)uVar19 != (_Rb_tree_node_base *)&local_4b0);
        }
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   *)local_4b8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_480,
               (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)local_3a8);
    if ((char)local_424 != '\0') {
      psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_3a8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_3a8._0_8_ = psVar15->_M_string_length;
      local_398._0_8_ = 0x17;
      local_398._8_8_ = "_autogen_timestamp_deps";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_3a8;
      cmCatViews_abi_cxx11_((string *)local_468,views_01);
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var16 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      p_Var1 = &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var16 != p_Var1) {
        do {
          pcVar20 = *(cmTarget **)(p_Var16 + 1);
          psVar15 = cmTarget::GetName_abi_cxx11_(pcVar20);
          local_4b8 = (undefined1  [8])&local_4a8;
          pcVar32 = (psVar15->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b8,pcVar32,pcVar32 + psVar15->_M_string_length);
          bVar12 = cmTarget::IsImported(pcVar20);
          if (((bVar12) &&
              (TVar13 = cmTarget::GetType(pcVar20), TVar13 < (UNKNOWN_LIBRARY|STATIC_LIBRARY))) &&
             ((0x106U >> (TVar13 & 0x1f) & 1) != 0)) {
            psVar15 = cmTarget::GetName_abi_cxx11_(pcVar20);
            local_398._8_8_ = (psVar15->_M_dataplus)._M_p;
            local_398._0_8_ = psVar15->_M_string_length;
            local_3a8._0_8_ = (pointer)0x15;
            local_3a8._8_8_ = "$<TARGET_LINKER_FILE:";
            local_388._0_8_ = (pointer)0x1;
            local_388._8_8_ = (long)"&>" + 1;
            views_02._M_len = 3;
            views_02._M_array = (iterator)local_3a8;
            cmCatViews_abi_cxx11_((string *)local_4d8,views_02);
            std::__cxx11::string::operator=((string *)local_4b8,(string *)local_4d8);
            if ((cmGeneratorTarget *)local_4d8._0_8_ != (cmGeneratorTarget *)(local_4d8 + 0x10)) {
              operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_480,(value_type *)local_4b8);
          if (local_4b8 != (undefined1  [8])&local_4a8) {
            operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
          }
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != p_Var1);
      }
      std::make_unique<cmCustomCommand>();
      pcVar32 = (this->Dir).Work._M_dataplus._M_p;
      if (pcVar32 == (pointer)0x0) {
        pcVar32 = "";
      }
      pcVar28 = (char *)((local_4e0._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar15 = &(local_4e0._M_head_impl)->WorkingDirectory;
      strlen(pcVar32);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar28,(ulong)pcVar32);
      _Var8._M_head_impl = local_4e0._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a0,&local_248);
      cmCustomCommand::SetByproducts(_Var8._M_head_impl,&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      _Var8._M_head_impl = local_4e0._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b8,&local_480);
      cmCustomCommand::SetDepends(_Var8._M_head_impl,&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      _Var8._M_head_impl = local_4e0._M_head_impl;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                (&local_d0,&local_1a8);
      cmCustomCommand::SetCommandLines(_Var8._M_head_impl,(cmCustomCommandLines *)&local_d0);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_d0);
      cmCustomCommand::SetCMP0116Status(local_4e0._M_head_impl,NEW);
      cmCustomCommand::SetEscapeOldStyle(local_4e0._M_head_impl,false);
      local_3c0._8_8_ = local_4e0._M_head_impl;
      local_4e0._M_head_impl = (cmCustomCommand *)0x0;
      pcVar20 = cmLocalGenerator::AddUtilityCommand
                          (this->LocalGen,(string *)local_468,true,
                           (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                           (local_3c0 + 8));
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                 (local_3c0 + 8));
      pcVar6 = this->LocalGen;
      pcVar21 = (cmGeneratorTarget *)operator_new(0x8c0);
      cmGeneratorTarget::cmGeneratorTarget(pcVar21,pcVar20,pcVar6);
      local_3c0._0_8_ = pcVar21;
      cmLocalGenerator::AddGeneratorTarget
                (pcVar6,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        local_3c0);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)local_3c0
                );
      if ((this->TargetsFolder)._M_string_length != 0) {
        local_3a8._0_8_ = local_398;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"FOLDER","");
        cmTarget::SetProperty(pcVar20,(string *)local_3a8,(cmValue)&this->TargetsFolder);
        if ((undefined1 *)local_3a8._0_8_ != local_398) {
          operator_delete((void *)local_3a8._0_8_,local_398._0_8_ + 1);
        }
      }
      pbVar25 = local_480.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_480.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_480.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar33 = &(local_480.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          if (paVar33 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((cmGeneratorTarget *)(paVar33 + -1))->Target) {
            operator_delete(((cmGeneratorTarget *)(paVar33 + -1))->Target,
                            (ulong)((long)&((cmLocalGenerator *)paVar33->_M_allocated_capacity)->
                                           _vptr_cmLocalGenerator + 1));
          }
          pcVar21 = (cmGeneratorTarget *)(paVar33 + 1);
          paVar33 = paVar33 + 2;
        } while (pcVar21 !=
                 (cmGeneratorTarget *)
                 local_480.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        local_480.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar25;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_480,(value_type *)local_468);
      anon_unknown.dwarf_1a1c218::AddAutogenExecutableToDependencies
                ((GenVarsT *)
                 local_3f0.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_480);
      anon_unknown.dwarf_1a1c218::AddAutogenExecutableToDependencies(local_488,&local_480);
      local_40 = (pointer)0x6d617473656d6974;
      local_38 = 0x70;
      local_3a8._8_8_ = (this->Dir).Build._M_dataplus._M_p;
      local_3a8._0_8_ = (this->Dir).Build._M_string_length;
      local_398._0_8_ = 1;
      local_398._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
      local_388._0_8_ = strlen((char *)&local_40);
      views_03._M_len = 3;
      views_03._M_array = (iterator)local_3a8;
      local_388._8_8_ = &local_40;
      cmCatViews_abi_cxx11_((string *)local_4b8,views_03);
      local_3a8._8_8_ = (this->Dir).Build._M_dataplus._M_p;
      local_3a8._0_8_ = (this->Dir).Build._M_string_length;
      local_398._0_8_ = 5;
      local_398._8_8_ = "/deps";
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_3a8;
      cmCatViews_abi_cxx11_((string *)local_4d8,views_04);
      local_420 = &(this->AutogenTarget).DepFile;
      std::__cxx11::string::operator=((string *)local_420,(string *)local_4d8);
      if ((cmGeneratorTarget *)local_4d8._0_8_ != (cmGeneratorTarget *)(local_4d8 + 0x10)) {
        operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
      }
      local_3a8._8_8_ = (this->Dir).RelativeBuild._M_dataplus._M_p;
      local_3a8._0_8_ = (this->Dir).RelativeBuild._M_string_length;
      local_398._0_8_ = 1;
      local_398._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
      local_388._0_8_ = strlen((char *)&local_40);
      views_05._M_len = 3;
      views_05._M_array = (iterator)local_3a8;
      local_388._8_8_ = &local_40;
      cmCatViews_abi_cxx11_((string *)local_4d8,views_05);
      std::__cxx11::string::operator=
                ((string *)&(this->AutogenTarget).DepFileRuleName,(string *)local_4d8);
      if ((cmGeneratorTarget *)local_4d8._0_8_ != (cmGeneratorTarget *)(local_4d8 + 0x10)) {
        operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
      }
      psVar15 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_3a8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_3a8._0_8_ = psVar15->_M_string_length;
      local_398._0_8_ = (cmCustomCommand *)0x2;
      local_398._8_8_ = "-E";
      local_388._0_8_ = (pointer)0x5;
      local_388._8_8_ = "touch";
      local_388._16_8_ = local_4b0;
      _Stack_370._M_p = (pointer)local_4b8;
      ilist_01._M_len = 4;
      ilist_01._M_array = (iterator)local_3a8;
      cmMakeCommandLine((cmCustomCommandLine *)local_4d8,ilist_01);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_418,(cmCustomCommandLine *)local_4d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4d8);
      AddGeneratedSource(this,(string *)local_4b8,
                         (GenVarsT *)
                         local_3f0.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::make_unique<cmCustomCommand>();
      uVar19 = local_3a8._0_8_;
      _Var8._M_head_impl = local_4e0._M_head_impl;
      local_3a8._0_8_ = (pointer)0x0;
      local_4e0._M_head_impl = (cmCustomCommand *)uVar19;
      if (_Var8._M_head_impl != (cmCustomCommand *)0x0) {
        cmCustomCommand::~cmCustomCommand(_Var8._M_head_impl);
        operator_delete(_Var8._M_head_impl,0x138);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_3a8);
      _Var8._M_head_impl = local_4e0._M_head_impl;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_4b8,
                 (pointer)((long)&(local_4b0->Outputs).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)local_4b8));
      cmCustomCommand::SetOutputs(_Var8._M_head_impl,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      _Var8._M_head_impl = local_4e0._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8,&local_228);
      cmCustomCommand::SetByproducts(_Var8._M_head_impl,&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
      _Var8._M_head_impl = local_4e0._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_100,&local_480);
      cmCustomCommand::SetDepends(_Var8._M_head_impl,&local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      _Var8._M_head_impl = local_4e0._M_head_impl;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                (&local_118,&local_418);
      cmCustomCommand::SetCommandLines(_Var8._M_head_impl,(cmCustomCommandLines *)&local_118);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_118);
      cmCustomCommand::SetComment(local_4e0._M_head_impl,(char *)local_400);
      pcVar32 = (this->Dir).Work._M_dataplus._M_p;
      pcVar28 = "";
      if (pcVar32 != (pointer)0x0) {
        pcVar28 = pcVar32;
      }
      pcVar23 = (char *)((local_4e0._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar15 = &(local_4e0._M_head_impl)->WorkingDirectory;
      strlen(pcVar28);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar23,(ulong)pcVar28);
      cmCustomCommand::SetCMP0116Status(local_4e0._M_head_impl,NEW);
      cmCustomCommand::SetEscapeOldStyle(local_4e0._M_head_impl,false);
      cmCustomCommand::SetDepfile(local_4e0._M_head_impl,local_420);
      (local_4e0._M_head_impl)->StdPipesUTF8 = true;
      local_3c8._M_head_impl = local_4e0._M_head_impl;
      local_4e0._M_head_impl = (cmCustomCommand *)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_3c8,
                 false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_3c8);
      pbVar27 = local_480.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar25 = local_480.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_480.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_480.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar33 = &(local_480.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          if (paVar33 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((cmGeneratorTarget *)(paVar33 + -1))->Target) {
            operator_delete(((cmGeneratorTarget *)(paVar33 + -1))->Target,
                            (ulong)((long)&((cmLocalGenerator *)paVar33->_M_allocated_capacity)->
                                           _vptr_cmLocalGenerator + 1));
          }
          pcVar21 = (cmGeneratorTarget *)(paVar33 + 1);
          paVar33 = paVar33 + 2;
        } while (pcVar21 != (cmGeneratorTarget *)pbVar27);
        local_480.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar25;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_480,(value_type *)local_4b8);
      pcVar11 = local_418.
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pcVar10 = local_418.
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pbVar25 = (pointer)local_418.
                         super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      if (local_418.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_418.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pbVar25);
          paVar33 = &pbVar25->field_2;
          pbVar25 = (pointer)(paVar33->_M_local_buf + 8);
        } while ((pointer)(paVar33->_M_local_buf + 8) != pcVar11);
        local_418.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar10;
      }
      local_3f8 = (element_type *)0x0;
      *(undefined1 *)
       &(local_400->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 0;
      if (local_4b8 != (undefined1  [8])&local_4a8) {
        operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_4e0);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      if ((cmCustomCommand *)local_468._0_8_ != (cmCustomCommand *)local_458) {
        operator_delete((void *)local_468._0_8_,(ulong)(local_458._0_8_ + 1));
      }
    }
    std::make_unique<cmCustomCommand>();
    pcVar32 = (this->Dir).Work._M_dataplus._M_p;
    pcVar28 = "";
    if (pcVar32 != (pointer)0x0) {
      pcVar28 = pcVar32;
    }
    pcVar23 = *(char **)(local_468._0_8_ + 0xd0);
    psVar15 = (string *)(local_468._0_8_ + 200);
    strlen(pcVar28);
    std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar23,(ulong)pcVar28);
    uVar19 = local_468._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_130,&local_268);
    cmCustomCommand::SetByproducts((cmCustomCommand *)uVar19,&local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_130);
    uVar19 = local_468._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_148,&local_480);
    cmCustomCommand::SetDepends((cmCustomCommand *)uVar19,&local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_148);
    uVar19 = local_468._0_8_;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_160,&local_418);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)uVar19,(cmCustomCommandLines *)&local_160);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_160);
    cmCustomCommand::SetCMP0116Status((cmCustomCommand *)local_468._0_8_,NEW);
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_468._0_8_,false);
    cmCustomCommand::SetComment((cmCustomCommand *)local_468._0_8_,(char *)local_400);
    utilityName = &this->AutogenTarget;
    local_3d0._M_p = (pointer)local_468._0_8_;
    local_468._0_8_ = (cmCustomCommand *)0x0;
    pcVar20 = cmLocalGenerator::AddUtilityCommand
                        (this->LocalGen,&utilityName->Name,true,
                         (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                         &local_3d0);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_3d0);
    pcVar6 = this->LocalGen;
    pcVar21 = (cmGeneratorTarget *)operator_new(0x8c0);
    cmGeneratorTarget::cmGeneratorTarget(pcVar21,pcVar20,pcVar6);
    local_3d8._M_head_impl = pcVar21;
    cmLocalGenerator::AddGeneratorTarget
              (pcVar6,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                      &local_3d8);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&local_3d8)
    ;
    if ((this->AutogenTarget).DependOrigin == true) {
      psVar22 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->GenTarget);
      for (p_Var16 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var16 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        cmTarget::AddUtility(pcVar20,(string *)(p_Var16 + 1),false,this->Makefile);
      }
    }
    if ((char)local_424 == '\0') {
      for (p_Var16 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_left;
          (_Rb_tree_header *)p_Var16 !=
          &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        psVar15 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var16 + 1));
        cmTarget::AddUtility(pcVar20,psVar15,false,this->Makefile);
      }
    }
    if ((this->TargetsFolder)._M_string_length != 0) {
      local_3a8._0_8_ = local_398;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"FOLDER","");
      cmTarget::SetProperty(pcVar20,(string *)local_3a8,(cmValue)&this->TargetsFolder);
      if ((undefined1 *)local_3a8._0_8_ != local_398) {
        operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
      }
    }
    cmTarget::AddUtility(this->GenTarget->Target,&utilityName->Name,false,this->Makefile);
    if ((this->AutogenTarget).GlobalTarget == true) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,this->LocalGen,&utilityName->Name);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_480);
  }
  else {
    for (p_Var16 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var16 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      pcVar20 = this->GenTarget->Target;
      psVar15 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var16 + 1));
      cmTarget::AddUtility(pcVar20,psVar15,false,this->Makefile);
    }
    if (((this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_388._0_8_ = auStack_360 + 8;
      local_3a8._8_8_ = 0;
      local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
      local_388._8_8_ = 1;
      local_388._16_8_ = 0;
      _Stack_370._M_p = (pointer)0x0;
      uVar7 = (ulong)local_368 >> 0x20;
      local_368 = (pointer)CONCAT44((int)uVar7,0x3f800000);
      auStack_360._0_8_ = 0;
      auStack_360._8_8_ = 0;
      local_4b8 = (undefined1  [8])&local_4a8;
      local_4b0 = (cmCustomCommand *)0x0;
      local_4a8._M_allocated_capacity = local_4a8._M_allocated_capacity & 0xffffffffffffff00;
      local_468._8_8_ = (this->Dir).Build._M_dataplus._M_p;
      local_468._0_8_ = (this->Dir).Build._M_string_length;
      local_458._0_8_ = (pointer)0x8;
      local_458._8_8_ = "/autouic";
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_468;
      local_3a8._0_8_ = local_398;
      cmCatViews_abi_cxx11_((string *)local_4d8,views_00);
      local_170 = 6;
      pcStack_168 = ".stamp";
      suffix._M_str = ".stamp";
      suffix._M_len = 6;
      prefix._M_str = (char *)local_4d8._0_8_;
      prefix._M_len = local_4d8._8_8_;
      ConfigFileNamesAndGenex(this,(ConfigString *)local_3a8,(string *)local_4b8,prefix,suffix);
      if ((cmGeneratorTarget *)local_4d8._0_8_ != (cmGeneratorTarget *)(local_4d8 + 0x10)) {
        operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
      }
      AddGeneratedSource(this,(ConfigString *)local_3a8,local_488,false);
      psVar15 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_468._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_468._0_8_ = psVar15->_M_string_length;
      local_458._0_8_ = (pointer)0x2;
      local_458._8_8_ = "-E";
      local_448 = (pointer)0x5;
      local_440 = (pointer)0x69630c;
      local_438 = local_4b0;
      local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b8;
      ilist_00._M_len = 4;
      ilist_00._M_array = (iterator)local_468;
      cmMakeCommandLine((cmCustomCommandLine *)local_4d8,ilist_00);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_418,(cmCustomCommandLine *)local_4d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_468,&(this->Uic).UiFilesNoOptions);
      __x = (this->Uic).UiFilesWithOptions.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (this->Uic).UiFilesWithOptions.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__x != ppVar4) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_468,&__x->first);
          __x = __x + 1;
        } while (__x != ppVar4);
      }
      anon_unknown.dwarf_1a1c218::AddAutogenExecutableToDependencies
                (local_488,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_468);
      std::make_unique<cmCustomCommand>();
      uVar19 = local_4d8._0_8_;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_4b8,
                 (pointer)((long)&(local_4b0->Outputs).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)local_4b8));
      cmCustomCommand::SetOutputs((cmCustomCommand *)uVar19,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      uVar19 = local_4d8._0_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_468);
      cmCustomCommand::SetDepends((cmCustomCommand *)uVar19,&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      cmCustomCommand::SetComment((cmCustomCommand *)local_4d8._0_8_,"");
      pcVar28 = (this->Dir).Work._M_dataplus._M_p;
      pcVar23 = "";
      if (pcVar28 != (char *)0x0) {
        pcVar23 = pcVar28;
      }
      pcVar28 = *(char **)&((_Rb_tree_header *)(local_4d8._0_8_ + 0xd0))->_M_header;
      psVar31 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_4d8._0_8_ + 200);
      strlen(pcVar23);
      std::__cxx11::string::_M_replace((ulong)psVar31,0,pcVar28,(ulong)pcVar23);
      cmCustomCommand::SetCMP0116Status((cmCustomCommand *)local_4d8._0_8_,NEW);
      cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_4d8._0_8_,false);
      *(char *)(local_4d8._0_8_ + 0x12d) = '\x01';
      local_3b0._M_p = (pointer)local_4d8._0_8_;
      local_4d8._0_8_ = (cmGeneratorTarget *)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_3b0,
                 false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_3b0);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_4d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_468);
      if (local_4b8 != (undefined1  [8])&local_4a8) {
        operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_388);
      if ((undefined1 *)local_3a8._0_8_ != local_398) {
        operator_delete((void *)local_3a8._0_8_,local_398._0_8_ + 1);
      }
    }
    auStack_360._8_8_ = 0;
    _Stack_350._M_p = (pointer)0x0;
    local_368 = (pointer)0x0;
    auStack_360._0_8_ = 0;
    local_388._16_8_ = (cmCustomCommand *)0x0;
    _Stack_370._M_p = (pointer)0x0;
    local_388._0_8_ = (pointer)0x0;
    local_388._8_8_ = (char *)0x0;
    local_398._0_8_ = (cmCustomCommand *)0x0;
    local_398._8_8_ = (cmCustomCommand *)0x0;
    local_3a8._0_8_ = (pointer)0x0;
    local_3a8._8_8_ = (pointer)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_348);
    local_320._M_p = (pointer)&local_310;
    local_338 = 0;
    ppStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    local_318 = 0;
    local_310._M_local_buf[0] = '\0';
    local_300._M_p = (pointer)&local_2f0;
    local_2f8 = 0;
    local_2f0._M_local_buf[0] = '\0';
    local_2e0._M_p = (pointer)&local_2d0;
    local_2d8 = (char *)0x0;
    local_2d0._M_local_buf[0] = '\0';
    local_2c0._M_p = (pointer)&local_2b0;
    local_2b8 = 0;
    local_2b0._M_local_buf[0] = '\0';
    local_2a0._M_p = (pointer)&local_290;
    local_298 = 0;
    local_290._M_local_buf[0] = '\0';
    local_280._0_1_ = false;
    local_280._1_1_ = false;
    local_27e = true;
    local_27d._0_1_ = false;
    local_27d._1_1_ = false;
    local_27d._2_1_ = false;
    local_27d._3_1_ = false;
    local_278 = WARN;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_70,&local_268);
    cmCustomCommand::SetByproducts((cmCustomCommand *)local_3a8,&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_88,&local_418);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)local_3a8,(cmCustomCommandLines *)&local_88)
    ;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_88);
    cmCustomCommand::SetComment((cmCustomCommand *)local_3a8,(char *)local_400);
    cmMakefile::GetBacktrace(this->Makefile);
    cmCustomCommand::SetBacktrace((cmCustomCommand *)local_3a8,&local_1f8);
    if (local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pcVar28 = local_2d8;
    pcVar32 = (this->Dir).Work._M_dataplus._M_p;
    pcVar23 = "";
    if (pcVar32 != (pointer)0x0) {
      pcVar23 = pcVar32;
    }
    strlen(pcVar23);
    std::__cxx11::string::_M_replace((ulong)&local_2e0,0,pcVar28,(ulong)pcVar23);
    local_27d._2_1_ = true;
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_3a8,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_3a8,true);
    cmTarget::AddPreBuildCommand(this->GenTarget->Target,(cmCustomCommand *)local_3a8);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_3a8);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_418);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  if (local_400 != &local_3f0) {
    operator_delete(local_400,
                    CONCAT71(local_3f0.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_3f0.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  // Register info file as generated by CMake
  this->Makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Determine whether to use a depfile for the AUTOGEN target.
  const bool useNinjaDepfile = this->QtVersion >= IntegerVersion(5, 15) &&
    this->GlobalGen->GetName().find("Ninja") != std::string::npos;

  // Files provided by the autogen target
  std::vector<std::string> autogenByproducts;
  std::vector<std::string> timestampByproducts;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.CompilationFile, this->Moc, true);
    if (useNinjaDepfile) {
      if (this->MultiConfig) {
        // Make all mocs_compilation_<CONFIG>.cpp files byproducts of the
        // ${target}_autogen/timestamp custom command.
        // We cannot just use Moc.CompilationFileGenex here, because that
        // custom command runs cmake_autogen for each configuration.
        for (const auto& p : this->Moc.CompilationFile.Config) {
          timestampByproducts.push_back(p.second);
        }
      } else {
        timestampByproducts.push_back(this->Moc.CompilationFileGenex);
      }
    } else {
      autogenByproducts.push_back(this->Moc.CompilationFileGenex);
    }
  }

  if (this->Uic.Enabled) {
    for (const auto& file : this->Uic.UiHeaders) {
      this->AddGeneratedSource(file.first, this->Uic);
      autogenByproducts.push_back(file.second);
    }
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = cmStrCat("Automatic ", tools, " for target ",
                              this->GenTarget->GetName());
  }

  // Compose command lines
  // FIXME: Take advantage of our per-config mocs_compilation_$<CONFIG>.cpp
  // instead of fiddling with the include directories
  std::vector<std::string> configs;
  this->GlobalGen->GetQtAutoGenConfigs(configs);
  bool stdPipesUTF8 = true;
  cmCustomCommandLines commandLines;
  for (auto const& config : configs) {
    commandLines.push_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", "cmake_autogen",
        this->AutogenTarget.InfoFile, config }));
  }

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (this->GlobalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (this->AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      this->GenTarget->Target->AddUtility(depTarget->GetName(), false,
                                          this->Makefile);
    }

    if (!this->Uic.UiFilesNoOptions.empty() ||
        !this->Uic.UiFilesWithOptions.empty()) {
      // Add a generated timestamp file
      ConfigString timestampFile;
      std::string timestampFileGenex;
      ConfigFileNamesAndGenex(timestampFile, timestampFileGenex,
                              cmStrCat(this->Dir.Build, "/autouic"_s),
                              ".stamp"_s);
      this->AddGeneratedSource(timestampFile, this->Uic);

      // Add a step in the pre-build command to touch the timestamp file
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "touch",
                            timestampFileGenex }));

      // UIC needs to be re-run if any of the known UI files change or the
      // executable itself has been updated
      auto uicDependencies = this->Uic.UiFilesNoOptions;
      for (auto const& uiFile : this->Uic.UiFilesWithOptions) {
        uicDependencies.push_back(uiFile.first);
      }
      AddAutogenExecutableToDependencies(this->Uic, uicDependencies);

      // Add a rule file to cause the target to build if a dependency has
      // changed, which will trigger the pre-build command to run autogen
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(timestampFileGenex);
      cc->SetDepends(uicDependencies);
      cc->SetComment("");
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    cmCustomCommand cc;
    cc.SetByproducts(autogenByproducts);
    cc.SetCommandLines(commandLines);
    cc.SetComment(autogenComment.c_str());
    cc.SetBacktrace(this->Makefile->GetBacktrace());
    cc.SetWorkingDirectory(this->Dir.Work.c_str());
    cc.SetStdPipesUTF8(stdPipesUTF8);
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->GenTarget->Target->AddPreBuildCommand(std::move(cc));
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->GenTarget->GetLinkImplementationLibraries(
            config, cmGeneratorTarget::LinkInterfaceFor::Link);
        if (libs) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if (libTarget &&
                !StaticLibraryCycle(this->GenTarget, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    std::vector<std::string> dependencies(
      this->AutogenTarget.DependFiles.begin(),
      this->AutogenTarget.DependFiles.end());

    if (useNinjaDepfile) {
      // Create a custom command that generates a timestamp file and
      // has a depfile assigned. The depfile is created by JobDepFilesMergeT.
      //
      // Also create an additional '_autogen_timestamp_deps' that the custom
      // command will depend on. It will have no sources or commands to
      // execute, but it will have dependencies that would originally be
      // assigned to the pre-Qt 5.15 'autogen' target. These dependencies will
      // serve as a list of order-only dependencies for the custom command,
      // without forcing the custom command to re-execute.
      //
      // The dependency tree would then look like
      // '_autogen_timestamp_deps (order-only)' <- '/timestamp' file <-
      // '_autogen' target.
      const auto timestampTargetName =
        cmStrCat(this->GenTarget->GetName(), "_autogen_timestamp_deps");
      std::vector<std::string> timestampTargetProvides;
      cmCustomCommandLines timestampTargetCommandLines;

      // Add additional autogen target dependencies to
      // '_autogen_timestamp_deps'.
      for (const cmTarget* t : this->AutogenTarget.DependTargets) {
        std::string depname = t->GetName();
        if (t->IsImported()) {
          auto ttype = t->GetType();
          if (ttype == cmStateEnums::TargetType::STATIC_LIBRARY ||
              ttype == cmStateEnums::TargetType::SHARED_LIBRARY ||
              ttype == cmStateEnums::TargetType::UNKNOWN_LIBRARY) {
            depname = cmStrCat("$<TARGET_LINKER_FILE:", t->GetName(), ">");
          }
        }
        dependencies.push_back(depname);
      }

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetByproducts(timestampTargetProvides);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(timestampTargetCommandLines);
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cmTarget* timestampTarget = this->LocalGen->AddUtilityCommand(
        timestampTargetName, true, std::move(cc));
      this->LocalGen->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(timestampTarget, this->LocalGen));

      // Set FOLDER property on the timestamp target, so it appears in the
      // appropriate folder in an IDE or in the file api.
      if (!this->TargetsFolder.empty()) {
        timestampTarget->SetProperty("FOLDER", this->TargetsFolder);
      }

      // Make '/timestamp' file depend on '_autogen_timestamp_deps' and on the
      // moc and uic executables (whichever are enabled).
      dependencies.clear();
      dependencies.push_back(timestampTargetName);

      AddAutogenExecutableToDependencies(this->Moc, dependencies);
      AddAutogenExecutableToDependencies(this->Uic, dependencies);

      // Create the custom command that outputs the timestamp file.
      const char timestampFileName[] = "timestamp";
      const std::string outputFile =
        cmStrCat(this->Dir.Build, "/", timestampFileName);
      this->AutogenTarget.DepFile = cmStrCat(this->Dir.Build, "/deps");
      this->AutogenTarget.DepFileRuleName =
        cmStrCat(this->Dir.RelativeBuild, "/", timestampFileName);
      commandLines.push_back(cmMakeCommandLine(
        { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));

      this->AddGeneratedSource(outputFile, this->Moc);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(outputFile);
      cc->SetByproducts(timestampByproducts);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(commandLines);
      cc->SetComment(autogenComment.c_str());
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cc->SetDepfile(this->AutogenTarget.DepFile);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));

      // Alter variables for the autogen target which now merely wraps the
      // custom command
      dependencies.clear();
      dependencies.push_back(outputFile);
      commandLines.clear();
      autogenComment.clear();
    }

    // Create autogen target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(this->Dir.Work.c_str());
    cc->SetByproducts(autogenByproducts);
    cc->SetDepends(dependencies);
    cc->SetCommandLines(commandLines);
    cc->SetCMP0116Status(cmPolicies::NEW);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(autogenComment.c_str());
    cmTarget* autogenTarget = this->LocalGen->AddUtilityCommand(
      this->AutogenTarget.Name, true, std::move(cc));
    // Create autogen generator target
    this->LocalGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(autogenTarget, this->LocalGen));

    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::pair<std::string, bool>> const& depName :
           this->GenTarget->GetUtilities()) {
        autogenTarget->AddUtility(depName.Value.first, false, this->Makefile);
      }
    }
    if (!useNinjaDepfile) {
      // Add additional autogen target dependencies to autogen target
      for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
        autogenTarget->AddUtility(depTarget->GetName(), false, this->Makefile);
      }
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder);
    }

    // Add autogen target to the origin target dependencies
    this->GenTarget->Target->AddUtility(this->AutogenTarget.Name, false,
                                        this->Makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(this->LocalGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}